

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFont::AddGlyph(ImFont *this,ImFontConfig_conflict *cfg,ImWchar codepoint,float x0,float y0,
                float x1,float y1,float u0,float v0,float u1,float v1,float advance_x)

{
  ImFontGlyph *pIVar1;
  float fVar2;
  bool local_65;
  float local_64;
  float pad;
  ImFontGlyph *glyph;
  float char_off_x;
  float advance_x_original;
  float v1_local;
  float u1_local;
  float v0_local;
  float u0_local;
  float y1_local;
  float x1_local;
  float y0_local;
  float x0_local;
  ImWchar codepoint_local;
  ImFontConfig_conflict *cfg_local;
  ImFont *this_local;
  
  u0_local = x1;
  x1_local = x0;
  if (cfg != (ImFontConfig_conflict *)0x0) {
    fVar2 = ImClamp<float>(advance_x,cfg->GlyphMinAdvanceX,cfg->GlyphMaxAdvanceX);
    if ((fVar2 != advance_x) || (NAN(fVar2) || NAN(advance_x))) {
      if ((cfg->PixelSnapH & 1U) == 0) {
        local_64 = (fVar2 - advance_x) * 0.5;
      }
      else {
        local_64 = ImFloor((fVar2 - advance_x) * 0.5);
      }
      x1_local = local_64 + x0;
      u0_local = local_64 + x1;
    }
    advance_x = fVar2;
    if ((cfg->PixelSnapH & 1U) != 0) {
      advance_x = (float)(int)(fVar2 + 0.5);
    }
    advance_x = (cfg->GlyphExtraSpacing).x + advance_x;
  }
  ImVector<ImFontGlyph>::resize
            ((ImVector<ImFontGlyph> *)&this->Glyphs,(this->Glyphs).Size + L'\x01');
  pIVar1 = ImVector<ImFontGlyph>::back((ImVector<ImFontGlyph> *)&this->Glyphs);
  *(uint *)pIVar1 = *(uint *)pIVar1 & 3 | (uint)codepoint << 2;
  local_65 = false;
  if ((x1_local != u0_local) || (NAN(x1_local) || NAN(u0_local))) {
    local_65 = y0 != y1;
  }
  *(uint *)pIVar1 = *(uint *)pIVar1 & 0xfffffffd | (uint)local_65 << 1;
  *(uint *)pIVar1 = *(uint *)pIVar1 & 0xfffffffe;
  pIVar1->X0 = x1_local;
  pIVar1->Y0 = y0;
  pIVar1->X1 = u0_local;
  pIVar1->Y1 = y1;
  pIVar1->U0 = u0;
  pIVar1->V0 = v0;
  pIVar1->U1 = u1;
  pIVar1->V1 = v1;
  pIVar1->AdvanceX = advance_x;
  fVar2 = (float)this->ContainerAtlas->TexGlyphPadding + 0.99;
  this->DirtyLookupTables = true;
  this->MetricsTotalSurface =
       (int)((pIVar1->U1 - pIVar1->U0) * (float)this->ContainerAtlas->TexWidth + fVar2) *
       (int)((pIVar1->V1 - pIVar1->V0) * (float)this->ContainerAtlas->TexHeight + fVar2) +
       this->MetricsTotalSurface;
  return;
}

Assistant:

void ImFont::AddGlyph(const ImFontConfig* cfg, ImWchar codepoint, float x0, float y0, float x1, float y1, float u0, float v0, float u1, float v1, float advance_x)
{
    if (cfg != NULL)
    {
        // Clamp & recenter if needed
        const float advance_x_original = advance_x;
        advance_x = ImClamp(advance_x, cfg->GlyphMinAdvanceX, cfg->GlyphMaxAdvanceX);
        if (advance_x != advance_x_original)
        {
            float char_off_x = cfg->PixelSnapH ? ImFloor((advance_x - advance_x_original) * 0.5f) : (advance_x - advance_x_original) * 0.5f;
            x0 += char_off_x;
            x1 += char_off_x;
        }

        // Snap to pixel
        if (cfg->PixelSnapH)
            advance_x = IM_ROUND(advance_x);

        // Bake spacing
        advance_x += cfg->GlyphExtraSpacing.x;
    }

    Glyphs.resize(Glyphs.Size + 1);
    ImFontGlyph& glyph = Glyphs.back();
    glyph.Codepoint = (unsigned int)codepoint;
    glyph.Visible = (x0 != x1) && (y0 != y1);
    glyph.Colored = false;
    glyph.X0 = x0;
    glyph.Y0 = y0;
    glyph.X1 = x1;
    glyph.Y1 = y1;
    glyph.U0 = u0;
    glyph.V0 = v0;
    glyph.U1 = u1;
    glyph.V1 = v1;
    glyph.AdvanceX = advance_x;

    // Compute rough surface usage metrics (+1 to account for average padding, +0.99 to round)
    // We use (U1-U0)*TexWidth instead of X1-X0 to account for oversampling.
    float pad = ContainerAtlas->TexGlyphPadding + 0.99f;
    DirtyLookupTables = true;
    MetricsTotalSurface += (int)((glyph.U1 - glyph.U0) * ContainerAtlas->TexWidth + pad) * (int)((glyph.V1 - glyph.V0) * ContainerAtlas->TexHeight + pad);
}